

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test38(void)

{
  CMReturn In;
  CMReturn In_00;
  CMReturn In_01;
  undefined8 uVar1;
  allocator<char> local_2299;
  string local_2298;
  allocator<char> local_2271;
  string local_2270;
  CMReturn local_2250;
  uint64_t local_2238;
  uint64_t uStack_2230;
  uint64_t local_2228;
  pointer local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  allocator<char> local_21d9;
  string local_21d8;
  allocator<char> local_21b1;
  string local_21b0;
  CMReturn local_2190;
  uint64_t local_2178;
  uint64_t uStack_2170;
  uint64_t local_2168;
  pointer local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  allocator<char> local_2121;
  string local_2120;
  allocator<char> local_20f9;
  string local_20f8;
  undefined1 auStack_20d8 [8];
  CMReturn res;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2070;
  undefined1 local_2058 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2070,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_20b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_20b8._M_h._M_rehash_policy._4_4_ = 0;
  local_20b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_20b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_20b8._M_h._M_element_count = 0;
  local_20b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_20b8._M_h._M_bucket_count = 0;
  local_20b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_20b8);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2058,&local_2070,&local_20b8,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_20b8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2070);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20f8,"a",&local_20f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2120,"",&local_2121);
  local_2138 = 0;
  uStack_2130 = 0;
  local_2148 = 0;
  uStack_2140 = 1000000;
  local_2158 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2150 = 0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_20d8,(ConfusableMatcher *)local_2058,&local_20f8,&local_2120,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,ZEXT824(matcher.TheMap[0xff].
                                                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
                     ));
  std::__cxx11::string::~string((string *)&local_2120);
  std::allocator<char>::~allocator(&local_2121);
  std::__cxx11::string::~string((string *)&local_20f8);
  std::allocator<char>::~allocator(&local_20f9);
  local_2168 = res.Size;
  local_2178 = (uint64_t)auStack_20d8;
  uStack_2170 = res.Start;
  In.Size = res.Start;
  In.Start = (uint64_t)auStack_20d8;
  In._16_8_ = res.Size;
  AssertMatch(In,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21b0,"",&local_21b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21d8,"",&local_21d9);
  local_21f8 = 0;
  uStack_21f0 = 0;
  local_2208 = 0;
  uStack_2200 = 1000000;
  local_2218 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2210 = 0;
  ConfusableMatcher::IndexOf
            (&local_2190,(ConfusableMatcher *)local_2058,&local_21b0,&local_21d8,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,ZEXT824(matcher.TheMap[0xff].
                                                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
                     ));
  res.Size = local_2190._16_8_;
  auStack_20d8 = (undefined1  [8])local_2190.Start;
  res.Start = local_2190.Size;
  std::__cxx11::string::~string((string *)&local_21d8);
  std::allocator<char>::~allocator(&local_21d9);
  std::__cxx11::string::~string((string *)&local_21b0);
  std::allocator<char>::~allocator(&local_21b1);
  local_2228 = res.Size;
  local_2238 = (uint64_t)auStack_20d8;
  uStack_2230 = res.Start;
  In_00.Size = res.Start;
  In_00.Start = (uint64_t)auStack_20d8;
  In_00._16_8_ = res.Size;
  AssertMatch(In_00,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2270,"",&local_2271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2298,"a",&local_2299);
  uVar1 = 1000000;
  ConfusableMatcher::IndexOf
            (&local_2250,(ConfusableMatcher *)local_2058,&local_2270,&local_2298,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,ZEXT824(matcher.TheMap[0xff].
                                                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage))
                     ));
  res.Size = local_2250._16_8_;
  auStack_20d8 = (undefined1  [8])local_2250.Start;
  res.Start = local_2250.Size;
  std::__cxx11::string::~string((string *)&local_2298);
  std::allocator<char>::~allocator(&local_2299);
  std::__cxx11::string::~string((string *)&local_2270);
  std::allocator<char>::~allocator(&local_2271);
  In_01.Size = res.Size;
  In_01.Start = res.Start;
  In_01._16_8_ = uVar1;
  AssertNoMatch(In_01);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2058);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test38()
{
	std::vector<std::pair<std::string, std::string>> map;

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;

	auto matcher = ConfusableMatcher(map, { });
	auto res = matcher.IndexOf("a", "", opts);
	AssertMatch(res, 0, 0);

	res = matcher.IndexOf("", "", opts);
	AssertMatch(res, 0, 0);

	res = matcher.IndexOf("", "a", opts);
	AssertNoMatch(res);
}